

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

size_t lodepng_get_raw_size_idat(uint w,uint h,LodePNGColorMode *color)

{
  int iVar1;
  int in_ECX;
  
  iVar1 = 0;
  if ((uint)color < 7) {
    iVar1 = *(int *)(&DAT_0087f584 + ((ulong)color & 0xffffffff) * 4);
  }
  return (ulong)h *
         (((ulong)(w & 7) * (ulong)(uint)(iVar1 * in_ECX) + 7 >> 3) +
         (ulong)(w >> 3) * (ulong)(uint)(iVar1 * in_ECX));
}

Assistant:

static size_t lodepng_get_raw_size_idat(unsigned w, unsigned h, const LodePNGColorMode* color)
{
  /*will not overflow for any color type if roughly w * h < 268435455*/
  size_t bpp = lodepng_get_bpp(color);
  size_t line = ((w / 8) * bpp) + ((w & 7) * bpp + 7) / 8;
  return h * line;
}